

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibraryinfo.cpp
# Opt level: O3

unique_ptr<QSettings,_std::default_delete<QSettings>_> findConfiguration(void)

{
  _Tuple_impl<0UL,_QSettings_*,_std::default_delete<QSettings>_> _Var1;
  QString *pQVar2;
  char16_t *pcVar3;
  Data *pDVar4;
  qsizetype qVar5;
  Data *data;
  char16_t *pcVar6;
  bool bVar7;
  QSettings *pQVar8;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_QString> local_a8;
  QString local_88;
  QArrayData *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QString local_48;
  _Head_base<0UL,_QSettings_*,_false> local_28;
  
  pQVar2 = (anonymous_namespace)::qtconfManualPath;
  local_28._M_head_impl = *(QSettings **)(in_FS_OFFSET + 0x28);
  if ((anonymous_namespace)::qtconfManualPath != (QString *)0x0) {
    pQVar8 = (QSettings *)operator_new(0x10);
    QSettings::QSettings(pQVar8,pQVar2,IniFormat,(QObject *)0x0);
    *in_RDI = pQVar8;
    goto LAB_0020cb19;
  }
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = L":/qt/etc/qt.conf";
  local_48.d.size = 0x10;
  QLocale::QLocale((QLocale *)&local_68,C,AnyScript,AnyCountry);
  QResource::QResource((QResource *)&local_a8,&local_48,(QLocale *)&local_68);
  bVar7 = QResource::isValid((QResource *)&local_a8);
  QResource::~QResource((QResource *)&local_a8);
  QLocale::~QLocale((QLocale *)&local_68);
  if (bVar7) {
    pQVar8 = (QSettings *)operator_new(0x10);
    QSettings::QSettings(pQVar8,&local_48,IniFormat,(QObject *)0x0);
    *in_RDI = pQVar8;
  }
  else {
    bVar7 = QCoreApplication::instanceExists();
    if (bVar7) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QCoreApplication::applicationDirPath();
      local_a8.b.d.d = (Data *)0x0;
      local_a8.b.d.ptr = L"/qt6.conf";
      local_a8.b.d.size = 9;
      local_a8.a = (QString *)&local_68;
      QStringBuilder<QString_&,_QString>::convertTo<QString>(&local_88,&local_a8);
      pcVar3 = local_48.d.ptr;
      data = local_48.d.d;
      qVar5 = local_88.d.size;
      pDVar4 = local_88.d.d;
      local_88.d.d = local_48.d.d;
      local_48.d.d = pDVar4;
      local_48.d.ptr = local_88.d.ptr;
      local_88.d.ptr = pcVar3;
      local_88.d.size = local_48.d.size;
      local_48.d.size = qVar5;
      if (&data->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&data->super_QArrayData,2,0x10);
        }
      }
      if (&(local_a8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      bVar7 = QFile::exists(&local_48);
      if (bVar7) {
        pQVar8 = (QSettings *)operator_new(0x10);
        QSettings::QSettings(pQVar8,&local_48,IniFormat,(QObject *)0x0);
      }
      else {
        local_88.d.ptr = L"/qt.conf";
        local_88.d.d = (Data *)&local_68;
        QStringBuilder<QString_&,_const_char16_t_(&)[9]>::convertTo<QString>
                  ((QString *)&local_a8,
                   (QStringBuilder<QString_&,_const_char16_t_(&)[9]> *)&local_88);
        pcVar6 = local_48.d.ptr;
        pDVar4 = local_48.d.d;
        pcVar3 = local_a8.b.d.ptr;
        pQVar2 = local_a8.a;
        local_a8.a = (QString *)local_48.d.d;
        local_48.d.d = (Data *)pQVar2;
        local_48.d.ptr = (char16_t *)local_a8.b.d.d;
        local_a8.b.d.d = (Data *)pcVar6;
        local_a8.b.d.ptr = (char16_t *)local_48.d.size;
        local_48.d.size = (qsizetype)pcVar3;
        if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
          }
        }
        bVar7 = QFile::exists(&local_48);
        if (!bVar7) {
          if (local_68 != (QArrayData *)0x0) {
            LOCK();
            local_68->ref_ = (QBasicAtomicInt)(*(int *)&local_68->ref_ + -1);
            UNLOCK();
            if (*(int *)&local_68->ref_ == 0) {
              QArrayData::deallocate(local_68,2,0x10);
            }
          }
          goto LAB_0020cda3;
        }
        pQVar8 = (QSettings *)operator_new(0x10);
        QSettings::QSettings(pQVar8,&local_48,IniFormat,(QObject *)0x0);
      }
      *in_RDI = pQVar8;
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        local_68->ref_ = (QBasicAtomicInt)(*(int *)&local_68->ref_ + -1);
        UNLOCK();
        if (*(int *)&local_68->ref_ == 0) {
          QArrayData::deallocate(local_68,2,0x10);
        }
      }
    }
    else {
LAB_0020cda3:
      *in_RDI = 0;
    }
  }
  pDVar4 = local_48.d.d;
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0020cb19:
  _Var1.super__Head_base<0UL,_QSettings_*,_false>._M_head_impl =
       ((_Tuple_impl<0UL,_QSettings_*,_std::default_delete<QSettings>_> *)(in_FS_OFFSET + 0x28))->
       super__Head_base<0UL,_QSettings_*,_false>;
  if (_Var1.super__Head_base<0UL,_QSettings_*,_false>._M_head_impl ==
      (_Head_base<0UL,_QSettings_*,_false>)local_28._M_head_impl) {
    return (__uniq_ptr_data<QSettings,_std::default_delete<QSettings>,_true,_true>)
           (tuple<QSettings_*,_std::default_delete<QSettings>_>)
           _Var1.super__Head_base<0UL,_QSettings_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

static std::unique_ptr<QSettings> findConfiguration()
{
    if (qtconfManualPath)
        return std::make_unique<QSettings>(*qtconfManualPath, QSettings::IniFormat);

    QString qtconfig = QStringLiteral(":/qt/etc/qt.conf");
    if (QResource(qtconfig, QLocale::c()).isValid())
        return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
#ifdef Q_OS_DARWIN
    CFBundleRef bundleRef = CFBundleGetMainBundle();
    if (bundleRef) {
        QCFType<CFURLRef> urlRef = CFBundleCopyResourceURL(bundleRef,
                                                           QCFString("qt.conf"_L1),
                                                           0,
                                                           0);
        if (urlRef) {
            QCFString path = CFURLCopyFileSystemPath(urlRef, kCFURLPOSIXPathStyle);
            qtconfig = QDir::cleanPath(path);
            if (QFile::exists(qtconfig))
                return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
        }
    }
#endif
    if (QCoreApplication::instanceExists()) {
        QString pwd = QCoreApplication::applicationDirPath();
        qtconfig = pwd + u"/qt" QT_STRINGIFY(QT_VERSION_MAJOR) ".conf"_s;
        if (QFile::exists(qtconfig))
            return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
        qtconfig = pwd + u"/qt.conf";
        if (QFile::exists(qtconfig))
            return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
    }
    return nullptr;     //no luck
}